

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O0

void QCoreApplicationPrivate::sendPostedEvents(QObject *receiver,int event_type,QThreadData *data)

{
  long lVar1;
  int iVar2;
  Type TVar3;
  int iVar4;
  Type pQVar5;
  qsizetype qVar6;
  const_reference pQVar7;
  QThreadData *in_RDX;
  Type in_ESI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  bool bVar8;
  QObject *r;
  QEvent *e;
  bool allowDeferredDelete;
  bool postedBeforeOutermostLoop;
  int eventScopeLevel;
  int eventLoopLevel;
  QPostEvent *pe;
  qsizetype *i;
  unique_ptr<QEvent,_std::default_delete<QEvent>_> event_deleter;
  qsizetype startOffset;
  QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_kernel_qcoreapplication_cpp:1885:43)>
  relocker;
  QPostEvent pe_copy;
  CleanUp cleanup;
  unique_lock<QMutex> locker;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  undefined2 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffeda;
  undefined1 in_stack_fffffffffffffedb;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  QPostEvent *ev;
  QPostEventList *pQVar9;
  QPostEventList *this;
  Type local_ac;
  undefined1 local_90 [40];
  undefined1 *local_68;
  QBasicAtomicPointer<QMutexPrivate> QStack_60;
  QObject *local_58;
  QEvent *pQStack_50;
  undefined8 local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_ac = in_ESI;
  if (in_ESI == ~None) {
    local_ac = None;
  }
  if (in_RDI != (QObject *)0x0) {
    QObject::d_func((QObject *)0x340100);
    pQVar5 = QBasicAtomicPointer<QThreadData>::loadRelaxed
                       ((QBasicAtomicPointer<QThreadData> *)0x34010c);
    if (pQVar5 != in_RDX) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (char *)CONCAT44(in_stack_fffffffffffffedc,
                                  CONCAT13(in_stack_fffffffffffffedb,
                                           CONCAT12(in_stack_fffffffffffffeda,
                                                    in_stack_fffffffffffffed8))),
                 in_stack_fffffffffffffed4,
                 (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      QMessageLogger::warning
                ((QMessageLogger *)(local_90 + 8),
                 "QCoreApplication::sendPostedEvents: Cannot send posted events for objects in another thread"
                );
      goto LAB_003406f3;
    }
  }
  (in_RDX->postEventList).recursion = (in_RDX->postEventList).recursion + 1;
  (anonymous_namespace)::qt_unique_lock<QMutex,std::unique_lock<QMutex>>
            ((QMutex *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  qVar6 = QList<QPostEvent>::size(&(in_RDX->postEventList).super_QList<QPostEvent>);
  in_RDX->canWait = qVar6 == 0;
  qVar6 = QList<QPostEvent>::size(&(in_RDX->postEventList).super_QList<QPostEvent>);
  if (qVar6 != 0) {
    if (in_RDI == (QObject *)0x0) {
LAB_0034021a:
      in_RDX->canWait = true;
      local_90._0_8_ = (in_RDX->postEventList).startOffset;
      if ((local_ac == None) && (in_RDI == (QObject *)0x0)) {
        pQVar9 = (QPostEventList *)&(in_RDX->postEventList).startOffset;
      }
      else {
        pQVar9 = (QPostEventList *)local_90;
      }
      this = pQVar9;
      qVar6 = QList<QPostEvent>::size(&(in_RDX->postEventList).super_QList<QPostEvent>);
      (in_RDX->postEventList).insertionOffset = qVar6;
      sendPostedEvents::CleanUp::CleanUp((CleanUp *)&stack0xffffffffffffffc8,in_RDI,local_ac,in_RDX)
      ;
LAB_003402f7:
      while( true ) {
        do {
          ev = (QPostEvent *)(pQVar9->super_QList<QPostEvent>).d.d;
          qVar6 = QList<QPostEvent>::size(&(in_RDX->postEventList).super_QList<QPostEvent>);
          if ((qVar6 <= (long)ev) ||
             ((in_RDX->postEventList).insertionOffset <= (long)(pQVar9->super_QList<QPostEvent>).d.d
             )) goto LAB_003406c9;
          pQVar7 = QList<QPostEvent>::at
                             ((QList<QPostEvent> *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                              CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          (pQVar9->super_QList<QPostEvent>).d.d =
               (Data *)((long)&((QObject *)(pQVar9->super_QList<QPostEvent>).d.d)->_vptr_QObject + 1
                       );
        } while (pQVar7->event == (QEvent *)0x0);
        if (((in_RDI == (QObject *)0x0) || (in_RDI == pQVar7->receiver)) &&
           ((local_ac == None || (TVar3 = QEvent::type(pQVar7->event), local_ac == TVar3)))) break;
        in_RDX->canWait = false;
      }
      TVar3 = QEvent::type(pQVar7->event);
      if (TVar3 == DeferredDelete) {
        iVar2 = QDeferredDeleteEvent::loopLevel((QDeferredDeleteEvent *)pQVar7->event);
        iVar4 = QDeferredDeleteEvent::scopeLevel((QDeferredDeleteEvent *)pQVar7->event);
        bVar8 = true;
        if ((iVar2 + iVar4 <= in_RDX->loopLevel + in_RDX->scopeLevel) &&
           (((iVar2 != 0 || (bVar8 = true, in_RDX->loopLevel < 1)) &&
            (bVar8 = false, local_ac == DeferredDelete)))) {
          bVar8 = iVar2 + iVar4 == in_RDX->loopLevel + in_RDX->scopeLevel;
        }
        if (!bVar8) {
          if ((local_ac == None) && (in_RDI == (QObject *)0x0)) {
            local_48 = *(undefined8 *)&pQVar7->priority;
            local_58 = pQVar7->receiver;
            pQStack_50 = pQVar7->event;
            pQVar7->event = (QEvent *)0x0;
            QPostEventList::addEvent(this,ev);
          }
          goto LAB_003402f7;
        }
      }
      pQVar7->event->m_posted = false;
      QObject::d_func((QObject *)0x3405e4);
      QBasicAtomicInteger<int>::fetchAndSubAcquire
                ((QBasicAtomicInteger<int> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffecc);
      pQVar7->event = (QEvent *)0x0;
      std::unique_lock<QMutex>::unlock
                ((unique_lock<QMutex> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      QStack_60._q_value._M_b._M_p = (AtomicType)&DAT_aaaaaaaaaaaaaaaa;
      qScopeGuard<QCoreApplicationPrivate::sendPostedEvents(QObject*,int,QThreadData*)::__0>
                ((anon_class_8_1_5fba2456_for_m_func *)
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      std::unique_ptr<QEvent,std::default_delete<QEvent>>::
      unique_ptr<std::default_delete<QEvent>,void>
                ((unique_ptr<QEvent,_std::default_delete<QEvent>_> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (pointer)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      QCoreApplication::sendEvent
                ((QObject *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (QEvent *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      std::unique_ptr<QEvent,_std::default_delete<QEvent>_>::~unique_ptr
                ((unique_ptr<QEvent,_std::default_delete<QEvent>_> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      QScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/kernel/qcoreapplication.cpp:1885:43)>
      ::~QScopeGuard((QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_kernel_qcoreapplication_cpp:1885:43)>
                      *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      goto LAB_003402f7;
    }
    QObject::d_func((QObject *)0x3401eb);
    iVar2 = QBasicAtomicInteger<int>::loadAcquire((QBasicAtomicInteger<int> *)0x3401f7);
    if (iVar2 != 0) goto LAB_0034021a;
  }
  (in_RDX->postEventList).recursion = (in_RDX->postEventList).recursion + -1;
LAB_003406e6:
  std::unique_lock<QMutex>::~unique_lock
            ((unique_lock<QMutex> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
LAB_003406f3:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
LAB_003406c9:
  sendPostedEvents::CleanUp::~CleanUp((CleanUp *)this);
  goto LAB_003406e6;
}

Assistant:

void QCoreApplicationPrivate::sendPostedEvents(QObject *receiver, int event_type,
                                               QThreadData *data)
{
    if (event_type == -1) {
        // we were called by an obsolete event dispatcher.
        event_type = 0;
    }

    if (receiver && receiver->d_func()->threadData.loadRelaxed() != data) {
        qWarning("QCoreApplication::sendPostedEvents: Cannot send "
                 "posted events for objects in another thread");
        return;
    }

    ++data->postEventList.recursion;

    auto locker = qt_unique_lock(data->postEventList.mutex);

    // by default, we assume that the event dispatcher can go to sleep after
    // processing all events. if any new events are posted while we send
    // events, canWait will be set to false.
    data->canWait = (data->postEventList.size() == 0);

    if (data->postEventList.size() == 0
            || (receiver && !receiver->d_func()->postedEvents.loadAcquire())) {
        --data->postEventList.recursion;
        return;
    }

    data->canWait = true;

    // okay. here is the tricky loop. be careful about optimizing
    // this, it looks the way it does for good reasons.
    qsizetype startOffset = data->postEventList.startOffset;
    qsizetype &i = (!event_type && !receiver) ? data->postEventList.startOffset : startOffset;
    data->postEventList.insertionOffset = data->postEventList.size();

    // Exception-safe cleaning up without the need for a try/catch block
    struct CleanUp {
        Q_DISABLE_COPY_MOVE(CleanUp)

        QObject *receiver;
        int event_type;
        QThreadData *data;
        bool exceptionCaught;

        inline CleanUp(QObject *receiver, int event_type, QThreadData *data) :
            receiver(receiver), event_type(event_type), data(data), exceptionCaught(true)
        {}
        inline ~CleanUp()
        {
            if (exceptionCaught) {
                // since we were interrupted, we need another pass to make sure we clean everything up
                data->canWait = false;
            }

            --data->postEventList.recursion;
            if (!data->postEventList.recursion && !data->canWait && data->hasEventDispatcher())
                data->eventDispatcher.loadRelaxed()->wakeUp();

            // clear the global list, i.e. remove everything that was
            // delivered.
            if (!event_type && !receiver && data->postEventList.startOffset >= 0) {
                const QPostEventList::iterator it = data->postEventList.begin();
                data->postEventList.erase(it, it + data->postEventList.startOffset);
                data->postEventList.insertionOffset -= data->postEventList.startOffset;
                Q_ASSERT(data->postEventList.insertionOffset >= 0);
                data->postEventList.startOffset = 0;
            }
        }
    };
    CleanUp cleanup(receiver, event_type, data);

    while (i < data->postEventList.size()) {
        // avoid live-lock
        if (i >= data->postEventList.insertionOffset)
            break;

        const QPostEvent &pe = data->postEventList.at(i);
        ++i;

        if (!pe.event)
            continue;
        if ((receiver && receiver != pe.receiver) || (event_type && event_type != pe.event->type())) {
            data->canWait = false;
            continue;
        }

        if (pe.event->type() == QEvent::DeferredDelete) {
            // DeferredDelete events are sent either
            // 1) when the event loop that posted the event has returned; or
            // 2) if explicitly requested (with QEvent::DeferredDelete) for
            //    events posted by the current event loop; or
            // 3) if the event was posted before the outermost event loop.

            const int eventLoopLevel = static_cast<QDeferredDeleteEvent *>(pe.event)->loopLevel();
            const int eventScopeLevel = static_cast<QDeferredDeleteEvent *>(pe.event)->scopeLevel();

            const bool postedBeforeOutermostLoop = eventLoopLevel == 0;
            const bool allowDeferredDelete =
                (eventLoopLevel + eventScopeLevel > data->loopLevel + data->scopeLevel
                 || (postedBeforeOutermostLoop && data->loopLevel > 0)
                 || (event_type == QEvent::DeferredDelete
                     && eventLoopLevel + eventScopeLevel == data->loopLevel + data->scopeLevel));
            if (!allowDeferredDelete) {
                // cannot send deferred delete
                if (!event_type && !receiver) {
                    // we must copy it first; we want to re-post the event
                    // with the event pointer intact, but we can't delay
                    // nulling the event ptr until after re-posting, as
                    // addEvent may invalidate pe.
                    QPostEvent pe_copy = pe;

                    // null out the event so if sendPostedEvents recurses, it
                    // will ignore this one, as it's been re-posted.
                    const_cast<QPostEvent &>(pe).event = nullptr;

                    // re-post the copied event so it isn't lost
                    data->postEventList.addEvent(pe_copy);
                }
                continue;
            }
        }

        // first, we diddle the event so that we can deliver
        // it, and that no one will try to touch it later.
        pe.event->m_posted = false;
        QEvent *e = pe.event;
        QObject * r = pe.receiver;

        r->d_func()->postedEvents.fetchAndSubAcquire(1);
        Q_ASSERT(r->d_func()->postedEvents >= 0);

        // next, update the data structure so that we're ready
        // for the next event.
        const_cast<QPostEvent &>(pe).event = nullptr;

        locker.unlock();
        const auto relocker = qScopeGuard([&locker] { locker.lock(); });

        const std::unique_ptr<QEvent> event_deleter(e); // will delete the event (with the mutex unlocked)

        // after all that work, it's time to deliver the event.
        QCoreApplication::sendEvent(r, e);

        // careful when adding anything below this point - the
        // sendEvent() call might invalidate any invariants this
        // function depends on.
    }

    cleanup.exceptionCaught = false;
}